

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

bool __thiscall
CFG::expandNullableSymbols
          (CFG *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nullableSymbols)

{
  pointer ppPVar1;
  Production *__x;
  bool bVar2;
  pointer ppPVar3;
  
  ppPVar1 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (this->productionsP).
                 super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1) {
    __x = *ppPVar3;
    bVar2 = consistOnlyOfNullableSymbols(this,&__x->toP,nullableSymbols);
    if (bVar2) {
      this = (CFG *)nullableSymbols;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(nullableSymbols,&__x->fromP);
    }
  }
  return false;
}

Assistant:

bool CFG::expandNullableSymbols(std::vector<std::string> &nullableSymbols) {
    bool changed = false;
    for (Production *production: productionsP) {
        if (consistOnlyOfNullableSymbols(production->getToP(), nullableSymbols)) {
            nullableSymbols.push_back(production->getFromP());
        }
    }
    return changed;
}